

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

IDiagObjectModelDisplay * __thiscall Js::ResolvedObject::CreateDisplay(ResolvedObject *this)

{
  bool bVar1;
  ThreadContext *this_00;
  DebugManager *this_01;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar2;
  ReferencedArenaAdapter *pRVar3;
  TrackAllocData local_f0;
  code *local_c8;
  undefined8 local_c0;
  TrackAllocData local_b8;
  code *local_90;
  undefined8 local_88;
  TrackAllocData local_80;
  code *local_58;
  undefined8 local_50;
  TrackAllocData local_48;
  ReferencedArenaAdapter *local_20;
  ReferencedArenaAdapter *pRefArena;
  IDiagObjectModelDisplay *pOMDisplay;
  ResolvedObject *this_local;
  
  pRefArena = (ReferencedArenaAdapter *)0x0;
  pOMDisplay = (IDiagObjectModelDisplay *)this;
  this_00 = ScriptContext::GetThreadContext(this->scriptContext);
  this_01 = ThreadContext::GetDebugManager(this_00);
  local_20 = DebugManager::GetDiagnosticArena(this_01);
  bVar1 = VarIs<Js::TypedArrayBase>(this->obj);
  if (bVar1) {
    pAVar2 = &Memory::ReferencedArenaAdapter::Arena(local_20)->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_48,(type_info *)&RecyclableTypedArrayDisplay::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
               ,0x4c);
    pAVar2 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar2,&local_48);
    local_58 = Memory::ArenaAllocator::Alloc;
    local_50 = 0;
    pRVar3 = (ReferencedArenaAdapter *)
             new<Memory::ArenaAllocator>(0x38,(ArenaAllocator *)pAVar2,0x3f67b0);
    RecyclableTypedArrayDisplay::RecyclableTypedArrayDisplay
              ((RecyclableTypedArrayDisplay *)pRVar3,this);
    pRefArena = pRVar3;
  }
  else {
    bVar1 = VarIs<Js::ES5Array>(this->obj);
    if (bVar1) {
      pAVar2 = &Memory::ReferencedArenaAdapter::Arena(local_20)->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_80,(type_info *)&RecyclableES5ArrayDisplay::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                 ,0x50);
      pAVar2 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo(pAVar2,&local_80);
      local_90 = Memory::ArenaAllocator::Alloc;
      local_88 = 0;
      pRVar3 = (ReferencedArenaAdapter *)
               new<Memory::ArenaAllocator>(0x38,(ArenaAllocator *)pAVar2,0x3f67b0);
      RecyclableES5ArrayDisplay::RecyclableES5ArrayDisplay((RecyclableES5ArrayDisplay *)pRVar3,this)
      ;
      pRefArena = pRVar3;
    }
    else {
      bVar1 = Js::JavascriptArray::IsNonES5Array(this->obj);
      if (bVar1) {
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(this->obj);
        pAVar2 = &Memory::ReferencedArenaAdapter::Arena(local_20)->
                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_b8,(type_info *)&RecyclableArrayDisplay::typeinfo,0,0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                   ,0x59);
        pAVar2 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 TrackAllocInfo(pAVar2,&local_b8);
        local_c8 = Memory::ArenaAllocator::Alloc;
        local_c0 = 0;
        pRVar3 = (ReferencedArenaAdapter *)
                 new<Memory::ArenaAllocator>(0x38,(ArenaAllocator *)pAVar2,0x3f67b0);
        RecyclableArrayDisplay::RecyclableArrayDisplay((RecyclableArrayDisplay *)pRVar3,this);
        pRefArena = pRVar3;
      }
      else {
        pAVar2 = &Memory::ReferencedArenaAdapter::Arena(local_20)->
                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_f0,(type_info *)&RecyclableObjectDisplay::typeinfo,0,0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                   ,0x5d);
        pAVar2 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 TrackAllocInfo(pAVar2,&local_f0);
        pRVar3 = (ReferencedArenaAdapter *)
                 new<Memory::ArenaAllocator>(0x38,(ArenaAllocator *)pAVar2,0x3f67b0);
        RecyclableObjectDisplay::RecyclableObjectDisplay((RecyclableObjectDisplay *)pRVar3,this,0);
        pRefArena = pRVar3;
      }
    }
  }
  if ((((this->isConst & 1U) != 0) || (this->propId == 0x2d6)) || (this->propId == 0x2d7)) {
    (*(pRefArena->super_RefCounted)._vptr_RefCounted[6])(pRefArena,0x800);
  }
  return (IDiagObjectModelDisplay *)pRefArena;
}

Assistant:

IDiagObjectModelDisplay * ResolvedObject::CreateDisplay()
    {
        IDiagObjectModelDisplay* pOMDisplay = nullptr;
        ReferencedArenaAdapter* pRefArena = scriptContext->GetThreadContext()->GetDebugManager()->GetDiagnosticArena();

        if (Js::VarIs<Js::TypedArrayBase>(obj))
        {
            pOMDisplay = Anew(pRefArena->Arena(), RecyclableTypedArrayDisplay, this);
        }
        else if (Js::VarIs<Js::ES5Array>(obj))
        {
            pOMDisplay = Anew(pRefArena->Arena(), RecyclableES5ArrayDisplay, this);
        }
        else if (Js::JavascriptArray::IsNonES5Array(obj))
        {
            // DisableJIT-TODO: Review- is this correct?
#if ENABLE_COPYONACCESS_ARRAY
            // Make sure any NativeIntArrays are converted
            Js::JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(obj);
#endif
            pOMDisplay = Anew(pRefArena->Arena(), RecyclableArrayDisplay, this);
        }
        else
        {
            pOMDisplay = Anew(pRefArena->Arena(), RecyclableObjectDisplay, this);
        }

        if (this->isConst || this->propId == Js::PropertyIds::_super || this->propId == Js::PropertyIds::_superConstructor)
        {
            pOMDisplay->SetDefaultTypeAttribute(DBGPROP_ATTRIB_VALUE_READONLY);
        }

        return pOMDisplay;
    }